

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

size_t Qiniu_Seq_Read(void *buf,size_t unused,size_t n,Qiniu_Seq *self)

{
  Qiniu_Seq *pQVar1;
  size_t max;
  size_t i;
  char *p;
  Qiniu_Seq *self_local;
  size_t n_local;
  size_t unused_local;
  void *buf_local;
  
  pQVar1 = (Qiniu_Seq *)(self->limit - self->off);
  if (pQVar1 == (Qiniu_Seq *)0x0) {
    buf_local = (void *)0x0;
  }
  else {
    self_local = (Qiniu_Seq *)n;
    if (pQVar1 < n) {
      self_local = pQVar1;
    }
    for (max = 0; max < self_local; max = max + 1) {
      *(char *)((long)buf + max) =
           (char)((self->off + self->delta + max) % (ulong)(long)self->radix) + (char)self->base;
    }
    self->off = (long)&self_local->off + self->off;
    buf_local = self_local;
  }
  return (size_t)buf_local;
}

Assistant:

static size_t Qiniu_Seq_Read(void *buf, size_t unused, size_t n, Qiniu_Seq *self)
{
	char *p = (char *)buf;
	size_t i, max = self->limit - self->off;
	if (max <= 0)
	{
		return 0;
	}
	if (n > max)
	{
		n = (size_t)max;
	}
	for (i = 0; i < n; i++)
	{
		p[i] = (self->off + self->delta + i) % self->radix + self->base;
	}
	self->off += n;
	return n;
}